

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallDirectoryGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallDirectoryGenerator::cmInstallDirectoryGenerator
          (cmInstallDirectoryGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dirs,char *dest,char *file_permissions,char *dir_permissions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,char *component,MessageLevel message,char *literal_args,bool optional)

{
  size_type sVar1;
  pointer input;
  allocator local_3b;
  allocator local_3a;
  allocator local_39;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,dest,configurations,component,message);
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallDirectoryGenerator_0059ba98;
  this->LocalGenerator = (cmLocalGenerator *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->Directories,dirs);
  local_38 = &this->Directories;
  std::__cxx11::string::string((string *)&this->FilePermissions,file_permissions,&local_39);
  std::__cxx11::string::string((string *)&this->DirPermissions,dir_permissions,&local_3a);
  std::__cxx11::string::string((string *)&this->LiteralArguments,literal_args,&local_3b);
  this->Optional = optional;
  sVar1 = cmGeneratorExpression::Find(&(this->super_cmInstallGenerator).Destination);
  if (sVar1 != 0xffffffffffffffff) {
    (this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig = true;
  }
  for (input = (dirs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      ((this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig == false &&
      (input != (dirs->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish)); input = input + 1) {
    sVar1 = cmGeneratorExpression::Find(input);
    if (sVar1 != 0xffffffffffffffff) {
      (this->super_cmInstallGenerator).super_cmScriptGenerator.ActionsPerConfig = true;
    }
  }
  return;
}

Assistant:

cmInstallDirectoryGenerator
::cmInstallDirectoryGenerator(std::vector<std::string> const& dirs,
                              const char* dest,
                              const char* file_permissions,
                              const char* dir_permissions,
                              std::vector<std::string> const& configurations,
                              const char* component,
                              MessageLevel message,
                              const char* literal_args,
                              bool optional):
  cmInstallGenerator(dest, configurations, component, message),
  LocalGenerator(0),
  Directories(dirs),
  FilePermissions(file_permissions), DirPermissions(dir_permissions),
  LiteralArguments(literal_args), Optional(optional)
{
  // We need per-config actions if destination have generator expressions.
  if(cmGeneratorExpression::Find(Destination) != std::string::npos)
    {
    this->ActionsPerConfig = true;
    }

  // We need per-config actions if any directories have generator expressions.
  for(std::vector<std::string>::const_iterator i = dirs.begin();
      !this->ActionsPerConfig && i != dirs.end(); ++i)
    {
    if(cmGeneratorExpression::Find(*i) != std::string::npos)
      {
      this->ActionsPerConfig = true;
      }
    }
}